

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O3

bool __thiscall
pybind11::detail::
map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::load(map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,handle src,bool convert)

{
  PyObject *src_00;
  bool bVar1;
  int iVar2;
  dict_iterator __begin3;
  dict d;
  key_conv kconv;
  value_conv vconv;
  
  if ((src.m_ptr == (PyObject *)0x0) || (((src.m_ptr)->ob_type->tp_flags & 0x20000000) == 0)) {
    bVar1 = false;
  }
  else {
    (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
    __begin3.super_dict_readonly.pos = (ssize_t)src.m_ptr;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)this);
    __begin3.super_dict_readonly.obj.m_ptr = (PyObject *)0x0;
    __begin3.super_dict_readonly.key = (PyObject *)0x0;
    __begin3.super_dict_readonly.value = (PyObject *)0x0;
    iVar2 = PyDict_Next(src.m_ptr,&__begin3.super_dict_readonly.value,&__begin3,
                        &__begin3.super_dict_readonly.key);
    if ((iVar2 != 0) && (__begin3.super_dict_readonly.value != (PyObject *)0xffffffffffffffff)) {
      do {
        src_00 = __begin3.super_dict_readonly.key;
        d.super_object.super_handle.m_ptr =
             (object)&kconv.
                      super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      .value._M_string_length;
        kconv.
        super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        .value._M_dataplus._M_p = (pointer)0x0;
        kconv.
        super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        .value._M_string_length._0_1_ = 0;
        kconv.
        super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        .value.field_2._8_8_ =
             &vconv.
              super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              .value._M_string_length;
        vconv.
        super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        .value._M_dataplus._M_p = (pointer)0x0;
        vconv.
        super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        .value._M_string_length._0_1_ = 0;
        bVar1 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                        *)&d,__begin3.super_dict_readonly.obj,convert);
        if (!bVar1) {
LAB_002f0b08:
          if ((size_type *)
              kconv.
              super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              .value.field_2._8_8_ !=
              &vconv.
               super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               .value._M_string_length) {
            operator_delete((void *)kconv.
                                    super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                    .value.field_2._8_8_,
                            CONCAT71(vconv.
                                     super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                     .value._M_string_length._1_7_,
                                     (undefined1)
                                     vconv.
                                     super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                     .value._M_string_length) + 1);
          }
          if (d.super_object.super_handle.m_ptr !=
              (object)&kconv.
                       super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                       .value._M_string_length) {
            operator_delete((void *)d.super_object.super_handle.m_ptr,
                            CONCAT71(kconv.
                                     super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                     .value._M_string_length._1_7_,
                                     (undefined1)
                                     kconv.
                                     super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                     .value._M_string_length) + 1);
          }
          bVar1 = false;
          goto LAB_002f0b3c;
        }
        bVar1 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                        *)((long)&kconv.
                                  super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                  .value.field_2 + 8),(handle)src_00,convert);
        if (!bVar1) goto LAB_002f0b08;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&kconv.
                           super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                           .value.field_2 + 8));
        if ((size_type *)
            kconv.
            super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            .value.field_2._8_8_ !=
            &vconv.
             super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             .value._M_string_length) {
          operator_delete((void *)kconv.
                                  super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                  .value.field_2._8_8_,
                          CONCAT71(vconv.
                                   super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                   .value._M_string_length._1_7_,
                                   (undefined1)
                                   vconv.
                                   super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                   .value._M_string_length) + 1);
        }
        if (d.super_object.super_handle.m_ptr !=
            (object)&kconv.
                     super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     .value._M_string_length) {
          operator_delete((void *)d.super_object.super_handle.m_ptr,
                          CONCAT71(kconv.
                                   super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                   .value._M_string_length._1_7_,
                                   (undefined1)
                                   kconv.
                                   super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                   .value._M_string_length) + 1);
        }
        iVar2 = PyDict_Next(src.m_ptr,&__begin3.super_dict_readonly.value,&__begin3,
                            &__begin3.super_dict_readonly.key);
      } while ((iVar2 != 0) &&
              (__begin3.super_dict_readonly.value != (PyObject *)0xffffffffffffffff));
    }
    bVar1 = true;
LAB_002f0b3c:
    object::~object((object *)&__begin3.super_dict_readonly.pos);
  }
  return bVar1;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<dict>(src))
            return false;
        auto d = reinterpret_borrow<dict>(src);
        value.clear();
        for (auto it : d) {
            key_conv kconv;
            value_conv vconv;
            if (!kconv.load(it.first.ptr(), convert) ||
                !vconv.load(it.second.ptr(), convert))
                return false;
            value.emplace(cast_op<Key &&>(std::move(kconv)), cast_op<Value &&>(std::move(vconv)));
        }
        return true;
    }